

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Linear_Object_State_PDU.cpp
# Opt level: O1

void __thiscall
KDIS::PDU::Linear_Object_State_PDU::Decode
          (Linear_Object_State_PDU *this,KDataStream *stream,bool ignoreHeader)

{
  undefined1 *V;
  pointer pLVar1;
  pointer pLVar2;
  KUINT16 KVar3;
  KException *this_00;
  int iVar4;
  undefined7 in_register_00000011;
  byte bVar5;
  pointer pLVar6;
  LinearSegmentParameter local_98;
  
  KVar3 = KDataStream::GetBufferSize(stream);
  iVar4 = 0xc;
  if ((int)CONCAT71(in_register_00000011,ignoreHeader) == 0) {
    iVar4 = 0;
  }
  if (iVar4 + (uint)KVar3 < 0x28) {
    this_00 = (KException *)__cxa_allocate_exception(0x30);
    local_98.super_DataTypeBase._vptr_DataTypeBase = (_func_int **)&local_98.m_ObjApr;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_98,"Decode","");
    KException::KException(this_00,(KString *)&local_98,2);
    __cxa_throw(this_00,&KException::typeinfo,KException::~KException);
  }
  pLVar1 = (this->m_vSegments).
           super__Vector_base<KDIS::DATA_TYPE::LinearSegmentParameter,_std::allocator<KDIS::DATA_TYPE::LinearSegmentParameter>_>
           ._M_impl.super__Vector_impl_data._M_start;
  pLVar2 = (this->m_vSegments).
           super__Vector_base<KDIS::DATA_TYPE::LinearSegmentParameter,_std::allocator<KDIS::DATA_TYPE::LinearSegmentParameter>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  pLVar6 = pLVar1;
  if (pLVar2 != pLVar1) {
    do {
      (**(pLVar6->super_DataTypeBase)._vptr_DataTypeBase)(pLVar6);
      pLVar6 = pLVar6 + 1;
    } while (pLVar6 != pLVar2);
    (this->m_vSegments).
    super__Vector_base<KDIS::DATA_TYPE::LinearSegmentParameter,_std::allocator<KDIS::DATA_TYPE::LinearSegmentParameter>_>
    ._M_impl.super__Vector_impl_data._M_finish = pLVar1;
  }
  Object_State_Header::Decode(&this->super_Object_State_Header,stream,ignoreHeader);
  V = &(this->super_Object_State_Header).field_0x4b;
  KDataStream::Read(stream,V);
  (*(this->m_ReqID).super_DataTypeBase._vptr_DataTypeBase[3])(&this->m_ReqID,stream);
  (*(this->m_RecvID).super_DataTypeBase._vptr_DataTypeBase[3])(&this->m_RecvID,stream);
  (*(this->m_ObjTyp).super_DataTypeBase._vptr_DataTypeBase[3])(&this->m_ObjTyp,stream);
  if ((this->super_Object_State_Header).field_0x4b != '\0') {
    bVar5 = 0;
    do {
      DATA_TYPE::LinearSegmentParameter::LinearSegmentParameter(&local_98,stream);
      std::
      vector<KDIS::DATA_TYPE::LinearSegmentParameter,_std::allocator<KDIS::DATA_TYPE::LinearSegmentParameter>_>
      ::emplace_back<KDIS::DATA_TYPE::LinearSegmentParameter>(&this->m_vSegments,&local_98);
      DATA_TYPE::LinearSegmentParameter::~LinearSegmentParameter(&local_98);
      bVar5 = bVar5 + 1;
    } while (bVar5 < (byte)*V);
  }
  return;
}

Assistant:

void Linear_Object_State_PDU::Decode(KDataStream &stream, bool ignoreHeader /*= true*/ ) noexcept(false)
{
    if( ( stream.GetBufferSize() + ( ignoreHeader ? Header::HEADER6_PDU_SIZE : 0 ) ) < LINEAR_OBJECT_STATE_PDU_SIZE )throw KException( __FUNCTION__, NOT_ENOUGH_DATA_IN_BUFFER );

    m_vSegments.clear();

    Object_State_Header::Decode( stream, ignoreHeader );

    stream >> m_ui8NumSegment
           >> KDIS_STREAM m_ReqID
           >> KDIS_STREAM m_RecvID
           >> KDIS_STREAM m_ObjTyp;

    for( KUINT8 i = 0; i < m_ui8NumSegment; ++i )
    {
        m_vSegments.push_back( LinearSegmentParameter( stream ) );
    }
}